

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptl.cpp
# Opt level: O3

bool __thiscall pg::PTLSolver::search(PTLSolver *this,bitset *R,int top,int player)

{
  uint uVar1;
  uint v;
  Game *pGVar2;
  uint64_t *puVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int *__s;
  ostream *poVar8;
  size_t sVar9;
  bool bVar10;
  uint __len;
  uint startvertex;
  uint uVar11;
  size_t sVar12;
  uint *puVar13;
  ulong uVar14;
  bitset *Z_00;
  uint pl;
  ulong uVar15;
  bool bVar16;
  bitset Z;
  _label_vertex local_80;
  undefined1 local_70 [24];
  uint64_t *local_58;
  ulong local_50;
  ulong local_48;
  string *local_40;
  string **local_38;
  
  local_58 = (uint64_t *)((this->super_Solver).game)->n_vertices;
  uVar15 = (long)local_58 + 0x3f;
  local_50 = uVar15 >> 6;
  uVar14 = local_50 << 3;
  local_48 = uVar14;
  __s = (int *)operator_new__(uVar14);
  local_70._16_8_ = __s;
  if (0x3f < uVar15) {
    memset(__s,0,uVar14);
  }
  if (top == -1) {
    bVar10 = false;
  }
  else {
    local_40 = (string *)&this->path;
    uVar14 = (ulong)top;
    bVar10 = false;
    do {
      Z_00 = (bitset *)(local_70 + 0x10);
      uVar15 = uVar14 >> 6;
      if ((R->_bits[uVar15] >> (uVar14 & 0x3f) & 1) != 0) {
        local_38 = (string **)(1L << (uVar14 & 0x3f));
        uVar1 = ((this->super_Solver).game)->_priority[uVar14];
        *(ulong *)(__s + uVar15 * 2) = *(ulong *)(__s + uVar15 * 2) | (ulong)local_38;
        pl = uVar1 & 1;
        this->str[uVar14] = -1;
        iVar6 = (this->Q).pointer;
        (this->Q).pointer = iVar6 + 1;
        startvertex = (uint)uVar14;
        (this->Q).queue[iVar6] = startvertex;
        iVar6 = (this->Q).pointer;
        if (iVar6 != 0) {
          do {
            (this->Q).pointer = iVar6 + -1;
            v = (this->Q).queue[(long)iVar6 + -1];
            attractVertices(this,pl,v,R,Z_00,R);
            if ((pl ^ player) != 1) {
              attractTangles(this,pl,v,R,Z_00,R);
            }
            iVar6 = (this->Q).pointer;
          } while (iVar6 != 0);
        }
        if (1 < (this->super_Solver).trace) {
          poVar8 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\x1b[1;33mregion\x1b[m \x1b[1;36m",0x18);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[m",3);
          for (sVar9 = bitset::find_first(Z_00); sVar9 != 0xffffffffffffffff;
              sVar9 = bitset::find_next(Z_00,sVar9)) {
            poVar8 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," \x1b[1;38;5;15m",0xd);
            local_80.g = (this->super_Solver).game;
            local_80.v = (int)sVar9;
            poVar8 = operator<<(poVar8,&local_80);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[m",3);
            if (this->str[sVar9] != -1) {
              poVar8 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"->",2);
              local_80.g = (this->super_Solver).game;
              local_80.v = this->str[sVar9];
              operator<<(poVar8,&local_80);
            }
          }
          poVar8 = (this->super_Solver).logger;
          cVar4 = (char)poVar8;
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + cVar4);
          std::ostream::put(cVar4);
          std::ostream::flush();
        }
        if ((player == -1) || (pl == player)) {
          pGVar2 = (this->super_Solver).game;
          if (((((pGVar2->_owner)._bits[uVar15] & (ulong)local_38) == 0 ^ (byte)uVar1) & 1) == 0) {
            uVar11 = pGVar2->_outedges[pGVar2->_firstouts[uVar14]];
            if (uVar11 != 0xffffffff) {
              puVar13 = (uint *)(pGVar2->_outedges + (long)pGVar2->_firstouts[uVar14] + 1);
              do {
                if (((*(ulong *)(local_70._16_8_ + ((ulong)(long)(int)uVar11 >> 6) * 2 * 4) >>
                      ((ulong)uVar11 & 0x3f) & 1) == 0) &&
                   ((R->_bits[(ulong)(long)(int)uVar11 >> 6] & 1L << ((ulong)uVar11 & 0x3f)) != 0))
                goto LAB_001794bb;
                uVar11 = *puVar13;
                puVar13 = puVar13 + 1;
              } while (uVar11 != 0xffffffff);
            }
LAB_00179573:
            memset(this->pea_vidx,0,pGVar2->n_vertices << 2);
            this->pea_curidx = 1;
            bVar16 = extractTangles(this,startvertex,Z_00,this->str);
          }
          else {
            if (this->str[uVar14] != -1) goto LAB_00179573;
LAB_001794bb:
            __len = 1;
            uVar11 = -uVar1;
            if (0 < (int)uVar1) {
              uVar11 = uVar1;
            }
            if (9 < uVar11) {
              uVar15 = (ulong)uVar11;
              uVar5 = 4;
              do {
                __len = uVar5;
                uVar7 = (uint)uVar15;
                if (uVar7 < 100) {
                  __len = __len - 2;
                  goto LAB_001795b8;
                }
                if (uVar7 < 1000) {
                  __len = __len - 1;
                  goto LAB_001795b8;
                }
                if (uVar7 < 10000) goto LAB_001795b8;
                uVar15 = uVar15 / 10000;
                uVar5 = __len + 4;
              } while (99999 < uVar7);
              __len = __len + 1;
            }
LAB_001795b8:
            local_80.g = (Game *)local_70;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_80,(char)__len - (char)((int)uVar1 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((long)&(local_80.g)->n_vertices + (ulong)(uVar1 >> 0x1f)),__len,
                       uVar11);
            std::__cxx11::string::operator=(local_40,(string *)&local_80);
            if (local_80.g != (Game *)local_70) {
              operator_delete(local_80.g,local_70._0_8_ + 1);
            }
            bVar16 = search_rec(this,(bitset *)(local_70 + 0x10),startvertex,pl,R);
          }
          bVar10 = (bool)(bVar10 | bVar16);
        }
        __s = (int *)local_70._16_8_;
        sVar9 = R->_bitssize;
        if (sVar9 != 0) {
          puVar3 = R->_bits;
          sVar12 = 0;
          do {
            puVar3[sVar12] = puVar3[sVar12] & ~*(ulong *)(local_70._16_8_ + sVar12 * 2 * 4);
            sVar12 = sVar12 + 1;
          } while (sVar9 != sVar12);
        }
        if (local_50 != 0) {
          memset((void *)local_70._16_8_,0,local_50 << 3);
        }
      }
      bVar16 = uVar14 != 0;
      uVar14 = uVar14 - 1;
    } while (bVar16);
    __s = (int *)local_70._16_8_;
    if ((int *)local_70._16_8_ == (int *)0x0) {
      return bVar10;
    }
  }
  operator_delete__(__s);
  return bVar10;
}

Assistant:

bool
PTLSolver::search(bitset &R, int top, int player)
{
    bool changes = false;

    bitset Z(nodecount());

    // Partition the game <R>

    for (; top!=-1; top--) {
        // find next top
        if (!R[top]) continue;

        const int pr = priority(top);
        const int pl = priority(top)&1;

        Z[top] = true; // add to <Z>
        str[top] = -1;
        Q.push(top);

        while (Q.nonempty()) {
            const int v = Q.pop();
            /*/ R[v] = false; // remove from <R> */
            attractVertices(pl, v, R, Z, R);
            // attract tangles if correct player, or <player> equals -1
            if ((1-pl) != player) attractTangles(pl, v, R, Z, R);
        }

#ifndef NDEBUG
        if (trace >= 2) {
            // report region
            logger << "\033[1;33mregion\033[m \033[1;36m" << pr << "\033[m";
            for (auto v = Z.find_first(); v != bitset::npos; v = Z.find_next(v)) {
                logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                if (str[v] != -1) logger << "->" << label_vertex(str[v]);
            }
            logger << std::endl;
        }
#endif

        if (player == -1 or pl == player) {
            /**
             * Now Z is the current region and <top> the top vertex
             */

            bool closed_region = true;

            /**
             * Check if Z is locally closed by looking at <top>.
             */

            if (owner(top) == pl) {
                if (str[top] == -1) closed_region = false;
            } else {
                for (auto curedge = outs(top); *curedge != -1; curedge++) {
                    if (!Z[*curedge] and R[*curedge]) {
                        closed_region = false;
                        break;
                    }
                }
            }

            if (closed_region) {
                /**
                 * Extract tangles by computing SCCs starting at each top vertex.
                 * Note: each bottom SCC must contain a head vertex.
                 */

                memset(pea_vidx, 0, sizeof(int[nodecount()]));
                pea_curidx = 1;
                changes |= extractTangles(top, Z, str);
            } else {
                /**
                 * Not a closed region, go recursive.
                 */

               // initialize path (for trace output) to <pr>
               path = std::to_string(pr);
               changes |= search_rec(Z, top, pl, R);
            }
        }

        R -= Z;
        Z.reset();
    }

    return changes;
}